

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O2

void operator_delete(void *p)

{
  PagemapEntry *entry;
  ushort uVar1;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this;
  CapPtr<snmalloc::BatchedRemoteMessage,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  CVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 *puVar5;
  BackendSlabMetadata *meta;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  unsigned_long *puVar9;
  long lVar10;
  Array<uint16_t,_false___2_:_(true___1_:_0)> *pAVar11;
  ushort uVar12;
  ulong uVar13;
  undefined8 *in_FS_OFFSET;
  bool bVar14;
  
  this = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
         *in_FS_OFFSET;
  uVar4 = (ulong)p >> 10 & 0xfffffffffffffff0;
  entry = (PagemapEntry *)
          ((long)&((snmalloc::
                    BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                    ::concretePagemap.body)->
                  super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                  ).super_MetaEntryBase.meta + uVar4);
  uVar4 = *(ulong *)((long)&((snmalloc::
                              BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                              ::concretePagemap.body)->
                            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                            ).super_MetaEntryBase.remote_and_sizeclass + uVar4);
  puVar5 = (undefined1 *)(uVar4 & 0xffffffffffffff80);
  if (&this->remote_alloc ==
      (conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *)puVar5) {
    meta = (BackendSlabMetadata *)
           ((entry->
            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
            ).super_MetaEntryBase.meta & 0xfffffffffffffffe);
    *(meta->
     super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
     ).free_queue.end._M_elems[0] = p;
    (meta->
    super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
    ).free_queue.end._M_elems[0] = (void **)p;
    puVar5 = &(meta->
              super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
              ).free_queue.field_0x12;
    *(short *)puVar5 = *(short *)puVar5 + -1;
    if (*(short *)puVar5 == 0) {
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_local_object_slow(this,(Alloc<void>)p,entry,meta);
      return;
    }
  }
  else if (puVar5 != (undefined1 *)0x0) {
    lVar10 = (this->remote_dealloc_cache).capacity;
    lVar6 = lVar10 - *(long *)(snmalloc::sizeclass_metadata + (((uint)uVar4 & 0x7f) << 5));
    if (lVar6 == 0 || lVar10 < *(long *)(snmalloc::sizeclass_metadata + (((uint)uVar4 & 0x7f) << 5))
       ) {
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_remote_slow<snmalloc::CheckInitPthread>(this,entry,(Alloc<void>)p);
      return;
    }
    (this->remote_dealloc_cache).capacity = lVar6;
    uVar4 = (entry->
            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
            ).super_MetaEntryBase.meta;
    uVar13 = uVar4 & 0xfffffffffffffffe;
    if (p != (void *)0x0) {
      *(undefined8 *)p = 0;
    }
    uVar4 = (ulong)(((uint)(uVar4 >> 3) & 0x1fffffff) * 0x3352d >> 0x10 & 7);
    if (uVar13 != (this->remote_dealloc_cache).batching.open_meta._M_elems[uVar4]) {
      if (uVar13 != *(ulong *)((long)this->alloc_classes + uVar4 * 8 + -0x80)) {
        pAVar11 = &(this->remote_dealloc_cache).batching.open_builder._M_elems[uVar4].length;
        lVar10 = 0;
        uVar12 = 0;
        uVar7 = uVar4;
        uVar8 = uVar4;
        do {
          if (lVar10 == 0x10) {
            puVar9 = (this->remote_dealloc_cache).batching.open_meta._M_elems + uVar8;
            if (*puVar9 != 0) {
              CVar2 = snmalloc::BatchedRemoteMessage::mk_from_freelist_builder
                                ((this->remote_dealloc_cache).batching.open_builder._M_elems + uVar8
                                 ,&snmalloc::freelist::Object::key_root,*puVar9 >> 3);
              uVar3 = *(uint *)((long)&((snmalloc::
                                         BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                                         ::concretePagemap.body)->
                                       super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                                       ).super_MetaEntryBase.remote_and_sizeclass +
                               ((ulong)CVar2.unsafe_capptr >> 10 & 0xfffffffffffffff0)) >> 0xe &
                      0xff;
              *(this->remote_dealloc_cache).list._M_elems[uVar3].end._M_elems[0] =
                   &(CVar2.unsafe_capptr)->message_link;
              (this->remote_dealloc_cache).list._M_elems[uVar3].end._M_elems[0] =
                   (void **)&(CVar2.unsafe_capptr)->message_link;
              *puVar9 = 0;
            }
LAB_00109c02:
            *puVar9 = uVar13;
            (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar8].head._M_elems[0] = p;
            (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar8].end._M_elems[0] =
                 (void **)p;
            (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar8].length._M_elems[0] =
                 1;
            return;
          }
          if (*(long *)((long)(this->remote_dealloc_cache).batching.open_meta._M_elems +
                       lVar10 + uVar4 * 8) == 0) {
            puVar9 = (unsigned_long *)
                     ((long)(this->remote_dealloc_cache).batching.open_meta._M_elems +
                     lVar10 + uVar4 * 8);
            uVar8 = uVar7;
            goto LAB_00109c02;
          }
          uVar1 = pAVar11->_M_elems[0];
          bVar14 = uVar12 < uVar1;
          if (uVar12 <= uVar1) {
            uVar12 = uVar1;
          }
          if (bVar14) {
            uVar8 = uVar7;
          }
          lVar10 = lVar10 + 8;
          uVar7 = uVar7 + 1;
          pAVar11 = pAVar11 + 0xc;
        } while( true );
      }
      uVar4 = uVar4 + 1;
    }
    *(this->remote_dealloc_cache).batching.open_builder._M_elems[uVar4].end._M_elems[0] = p;
    (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar4].end._M_elems[0] = (void **)p;
    pAVar11 = &(this->remote_dealloc_cache).batching.open_builder._M_elems[uVar4].length;
    pAVar11->_M_elems[0] = pAVar11->_M_elems[0] + 1;
  }
  return;
}

Assistant:

void operator delete(void* p) EXCEPTSPEC
{
  snmalloc::libc::free(p);
}